

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_MuxRestructure(Gia_Man_t *pNew,Str_Ntk_t *pNtk,int iMux,int nMuxes,Vec_Int_t *vDelay,
                      int nLutSize,int fRecursive,int fOptArea,int fVerbose)

{
  int iVar1;
  
  if (fOptArea == 0) {
    if (fRecursive != 0) {
      iVar1 = Str_MuxRestructure2(pNew,pNtk,iMux,nMuxes,vDelay,nLutSize,fVerbose);
      return iVar1;
    }
  }
  else if (1 < nMuxes) {
    iVar1 = Str_MuxRestructureArea(pNew,pNtk,iMux,nMuxes,vDelay,nLutSize,fVerbose);
    return iVar1;
  }
  iVar1 = Str_MuxRestructure1(pNew,pNtk,iMux,nMuxes,vDelay,nLutSize,fVerbose);
  return iVar1;
}

Assistant:

int Str_MuxRestructure( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fRecursive, int fOptArea, int fVerbose )
{
    extern int Str_MuxRestructureArea( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fVerbose );
    if ( fOptArea )
    {
        if ( nMuxes < 2 )
            return Str_MuxRestructure1( pNew, pNtk, iMux, nMuxes, vDelay, nLutSize, fVerbose );
        return Str_MuxRestructureArea( pNew, pNtk, iMux, nMuxes, vDelay, nLutSize, fVerbose );
    }
    if ( fRecursive )
        return Str_MuxRestructure2( pNew, pNtk, iMux, nMuxes, vDelay, nLutSize, fVerbose );
    return Str_MuxRestructure1( pNew, pNtk, iMux, nMuxes, vDelay, nLutSize, fVerbose );
}